

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int fd;
  int n;
  int iStack_20;
  char buffer [5];
  int events_local;
  int status_local;
  uv_poll_t *handle_local;
  
  iStack_20 = events;
  buffer._1_4_ = status;
  iVar1 = uv_fileno(handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
            ,0x49,"uv_fileno((uv_handle_t*)handle, &fd)","==","0",(long)iVar1,"==",0);
    abort();
  }
  memset((void *)((long)&fd + 3),0,5);
  if ((iStack_20 & 8U) != 0) {
    do {
      sVar3 = recv(client_fd,(void *)((long)&fd + 3),5,1);
      bVar5 = false;
      if ((int)sVar3 == -1) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if (((int)sVar3 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
              ,0x50,"n >= 0 || errno != EINVAL");
      abort();
    }
    cli_pr_check = 1;
    iVar1 = uv_poll_stop(poll_req);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
              ,0x52,"uv_poll_stop(&poll_req[0])","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_poll_start(poll_req,3,poll_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
              ,0x55,"uv_poll_start(&poll_req[0], UV_READABLE | UV_WRITABLE, poll_cb)","==","0",
              (long)iVar1,"==",0);
      abort();
    }
  }
  if ((iStack_20 & 1U) != 0) {
    if ((int)eval_a == client_fd) {
      do {
        sVar3 = recv(client_fd,(void *)((long)&fd + 3),5,0);
        iVar1 = (int)sVar3;
        bVar5 = false;
        if (iVar1 == -1) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
      } while (bVar5);
      if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                ,0x5c,"n >= 0 || errno != EINVAL");
        abort();
      }
      if (cli_rd_check == 1) {
        iVar2 = strncmp((char *)((long)&fd + 3),"world",(long)iVar1);
        if ((long)iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                  ,0x5e,"strncmp(buffer, \"world\", n)","==","0",(long)iVar2,"==",0);
          abort();
        }
        if ((long)iVar1 != 5) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                  ,0x5f,"5","==","n",5,"==",(long)iVar1);
          abort();
        }
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        if ((long)iVar1 != 4) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                  ,99,"4","==","n",4,"==",(long)iVar1);
          abort();
        }
        iVar1 = strncmp((char *)((long)&fd + 3),"hello",(long)iVar1);
        if ((long)iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                  ,100,"strncmp(buffer, \"hello\", n)","==","0",(long)iVar1,"==",0);
          abort();
        }
        cli_rd_check = 1;
        do {
          do {
            sVar3 = recv(server_fd,(void *)((long)&fd + 3),5,0);
            iVar1 = (int)sVar3;
            bVar5 = false;
            if (iVar1 == -1) {
              piVar4 = __errno_location();
              bVar5 = *piVar4 == 4;
            }
          } while (bVar5);
          if (0 < iVar1) {
            if ((long)iVar1 != 5) {
              fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                      ,0x6b,"5","==","n",5,"==",(long)iVar1);
              abort();
            }
            iVar2 = strncmp((char *)((long)&fd + 3),"world",(long)iVar1);
            if ((long)iVar2 != 0) {
              fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                      ,0x6c,"strncmp(buffer, \"world\", n)","==","0",(long)iVar2,"==",0);
              abort();
            }
            cli_rd_check = 2;
          }
        } while (0 < iVar1);
        iVar1 = got_eagain();
        if (iVar1 == 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                  ,0x71,"got_eagain()");
          abort();
        }
      }
    }
    if ((int)eval_a == server_fd) {
      do {
        sVar3 = recv(server_fd,(void *)((long)&fd + 3),3,0);
        iVar1 = (int)sVar3;
        bVar5 = false;
        if (iVar1 == -1) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
      } while (bVar5);
      if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                ,0x78,"n >= 0 || errno != EINVAL");
        abort();
      }
      if ((long)iVar1 != 3) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                ,0x79,"3","==","n",3,"==",(long)iVar1);
        abort();
      }
      iVar1 = strncmp((char *)((long)&fd + 3),"foo",(long)iVar1);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
                ,0x7a,"strncmp(buffer, \"foo\", n)","==","0",(long)iVar1,"==",0);
        abort();
      }
      srv_rd_check = 1;
      uv_poll_stop(0x3501e0);
    }
  }
  if ((iStack_20 & 2U) != 0) {
    do {
      sVar3 = send(client_fd,"foo",3,0);
      iVar1 = (int)sVar3;
      bVar5 = false;
      if (iVar1 < 0) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if ((long)iVar1 != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll-oob.c"
              ,0x83,"3","==","n",3,"==",(long)iVar1);
      abort();
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT_PTR_EQ(handle, &poll_handle);
  ASSERT_EQ(1, uv_is_active((uv_handle_t*) handle));
  ASSERT_NOT_NULL(prev);
  ASSERT_NOT_NULL(curr);

  switch (poll_cb_called++) {
  case 0:
    ASSERT_EQ(status, UV_ENOENT);
    ASSERT_OK(memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT_OK(status);
    ASSERT_OK(memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_NE(0, memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT_OK(status);
    ASSERT_NE(0, memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_NE(0, memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT_OK(status);
    ASSERT_NE(0, memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_NE(0, memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT_EQ(status, UV_ENOENT);
    ASSERT_NE(0, memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT_OK(memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}